

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::update_favorites(Fl_File_Chooser *this)

{
  int *piVar1;
  char *src;
  int dstsize;
  int dstsize_00;
  uint uVar2;
  ulong uVar3;
  char menuname [2048];
  char pathname [2048];
  char acStack_1038 [2048];
  char local_838 [2056];
  
  Fl_Menu_::clear(&this->favoritesButton->super_Fl_Menu_);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,"bla");
  Fl_Menu_::clear(&this->favoritesButton->super_Fl_Menu_);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,add_favorites_label,0x80061,
                (Fl_Callback *)0x0,(void *)0x0,0);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,manage_favorites_label,0x8006d,
                (Fl_Callback *)0x0,(void *)0x0,0x80);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,filesystems_label,0x80066,(Fl_Callback *)0x0,
                (void *)0x0,0);
  src = fl_getenv("HOME");
  if (src != (char *)0x0) {
    quote_pathname(acStack_1038,src,dstsize);
    Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,acStack_1038,0x80068,(Fl_Callback *)0x0,
                  (void *)0x0,0);
  }
  uVar3 = 0;
  do {
    uVar2 = (uint)uVar3;
    sprintf(acStack_1038,"favorite%02d",uVar3);
    Fl_Preferences::get(prefs_,acStack_1038,local_838,"",0x800);
    if (local_838[0] == '\0') {
      return;
    }
    quote_pathname(acStack_1038,local_838,dstsize_00);
    if (uVar2 < 10) {
      Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,acStack_1038,uVar2 + 0x80030,
                    (Fl_Callback *)0x0,(void *)0x0,0);
    }
    else {
      Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,acStack_1038);
    }
    uVar3 = (ulong)(uVar2 + 1);
  } while (uVar2 + 1 != 100);
  piVar1 = &((this->favoritesButton->super_Fl_Menu_).menu_)->flags;
  *piVar1 = *piVar1 | 1;
  return;
}

Assistant:

void
Fl_File_Chooser::update_favorites()
{
  int		i;			// Looping var
  char		pathname[FL_PATH_MAX],		// Pathname
		menuname[2048];		// Menu name
  const char	*home;			// Home directory


  favoritesButton->clear();
  favoritesButton->add("bla");
  favoritesButton->clear();
  favoritesButton->add(add_favorites_label, FL_ALT + 'a', 0);
  favoritesButton->add(manage_favorites_label, FL_ALT + 'm', 0, 0, FL_MENU_DIVIDER);
  favoritesButton->add(filesystems_label, FL_ALT + 'f', 0);

  if ((home = get_homedir()) != NULL) {
    quote_pathname(menuname, home, sizeof(menuname));
    favoritesButton->add(menuname, FL_ALT + 'h', 0);
  }

  for (i = 0; i < 100; i ++) {
    sprintf(menuname, "favorite%02d", i);
    prefs_->get(menuname, pathname, "", sizeof(pathname));
    if (!pathname[0]) break;

    quote_pathname(menuname, pathname, sizeof(menuname));

    if (i < 10) favoritesButton->add(menuname, FL_ALT + '0' + i, 0);
    else favoritesButton->add(menuname);
  }

  if (i == 100) ((Fl_Menu_Item *)favoritesButton->menu())[0].deactivate();
}